

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool operator==(ON_wString *lhs,ON_wString *rhs)

{
  int element_count1;
  int iVar1;
  wchar_t *string1;
  wchar_t *string2;
  undefined1 local_1d;
  int length;
  ON_wString *rhs_local;
  ON_wString *lhs_local;
  
  element_count1 = ON_wString::Length(lhs);
  iVar1 = ON_wString::Length(rhs);
  local_1d = false;
  if (element_count1 == iVar1) {
    string1 = ON_wString::operator_cast_to_wchar_t_(lhs);
    string2 = ON_wString::operator_cast_to_wchar_t_(rhs);
    local_1d = ON_wString::EqualOrdinal(string1,element_count1,string2,element_count1,false);
  }
  return local_1d;
}

Assistant:

bool operator==( const ON_wString& lhs, const ON_wString& rhs )
{
  const int length = lhs.Length();
  return   (length == rhs.Length())
    && ON_wString::EqualOrdinal(
    static_cast<const wchar_t*>(lhs),
    length,
    static_cast<const wchar_t*>(rhs),
    length,
    false
    );
}